

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O1

void luaL_pushmodule(lua_State *L,char *modname,int sizehint)

{
  int iVar1;
  char *pcVar2;
  
  luaL_findtable(L,-10000,"_LOADED",0x10);
  lua_getfield(L,-1,modname);
  iVar1 = lua_type(L,-1);
  if (iVar1 != 5) {
    lua_settop(L,-2);
    pcVar2 = luaL_findtable(L,-0x2712,modname,sizehint);
    if (pcVar2 != (char *)0x0) {
      lj_err_callerv(L,LJ_ERR_BADMODN,modname);
    }
    lua_pushvalue(L,-1);
    lua_setfield(L,-3,modname);
  }
  lua_remove(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_pushmodule(lua_State *L, const char *modname, int sizehint)
{
  luaL_findtable(L, LUA_REGISTRYINDEX, "_LOADED", 16);
  lua_getfield(L, -1, modname);
  if (!lua_istable(L, -1)) {
    lua_pop(L, 1);
    if (luaL_findtable(L, LUA_GLOBALSINDEX, modname, sizehint) != NULL)
      lj_err_callerv(L, LJ_ERR_BADMODN, modname);
    lua_pushvalue(L, -1);
    lua_setfield(L, -3, modname);  /* _LOADED[modname] = new table. */
  }
  lua_remove(L, -2);  /* Remove _LOADED table. */
}